

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

bool __thiscall XmlRpc::XmlRpcValue::timeFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  int iVar1;
  undefined8 uVar2;
  void *__dest;
  int *in_RDX;
  ulong in_RSI;
  undefined4 *in_RDI;
  tm t;
  string stime;
  size_t valueEnd;
  undefined1 local_80 [4];
  undefined1 auStack_7c [4];
  undefined1 auStack_78 [4];
  undefined1 auStack_74 [4];
  undefined1 auStack_70 [4];
  undefined1 auStack_6c [12];
  undefined4 local_60;
  string local_48 [32];
  long local_28;
  int *local_20;
  ulong local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::__cxx11::string::find((char)in_RSI,0x3c);
  if (local_28 == -1) {
    local_1 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,local_18);
    uVar2 = std::__cxx11::string::c_str();
    iVar1 = __isoc99_sscanf(uVar2,"%4d%2d%2dT%2d:%2d:%2d",auStack_6c,auStack_70,auStack_74,
                            auStack_78,auStack_7c,local_80);
    local_1 = iVar1 == 6;
    if ((bool)local_1) {
      local_60 = 0xffffffff;
      *in_RDI = 5;
      __dest = operator_new(0x38);
      memcpy(__dest,local_80,0x38);
      *(void **)(in_RDI + 2) = __dest;
      iVar1 = std::__cxx11::string::length();
      *local_20 = iVar1 + *local_20;
    }
    std::__cxx11::string::~string(local_48);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool XmlRpcValue::timeFromXml(std::string const& valueXml, int* offset)
  {
    size_t valueEnd = valueXml.find('<', *offset);
    if (valueEnd == std::string::npos)
      return false;     // No end tag;

    std::string stime = valueXml.substr(*offset, valueEnd-*offset);

    struct tm t;
#ifdef _MSC_VER
    if (sscanf_s(stime.c_str(),"%4d%2d%2dT%2d:%2d:%2d",&t.tm_year,&t.tm_mon,&t.tm_mday,&t.tm_hour,&t.tm_min,&t.tm_sec) != 6)
#else
    if (sscanf(stime.c_str(),"%4d%2d%2dT%2d:%2d:%2d",&t.tm_year,&t.tm_mon,&t.tm_mday,&t.tm_hour,&t.tm_min,&t.tm_sec) != 6)
#endif
      return false;

    t.tm_isdst = -1;
    _type = TypeDateTime;
    _value.asTime = new struct tm(t);
    *offset += int(stime.length());
    return true;
  }